

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O0

void InitGammaTables(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&InitGammaTables::InitGammaTables_body_lock);
  if (iVar1 == 0) {
    if (InitGammaTables::InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) {
      InitGammaTables_body();
    }
    InitGammaTables::InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
    pthread_mutex_unlock((pthread_mutex_t *)&InitGammaTables::InitGammaTables_body_lock);
  }
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(InitGammaTables) {
  if (!kGammaTablesOk) {
    int v;
    const double scale = (double)(1 << GAMMA_TAB_FIX) / kGammaScale;
    const double norm = 1. / 255.;
    for (v = 0; v <= 255; ++v) {
      kGammaToLinearTab[v] =
          (uint16_t)(pow(norm * v, kGamma) * kGammaScale + .5);
    }
    for (v = 0; v <= GAMMA_TAB_SIZE; ++v) {
      kLinearToGammaTab[v] = (int)(255. * pow(scale * v, 1. / kGamma) + .5);
    }
    kGammaTablesOk = 1;
  }
}